

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::CollectTargets(cmComputeTargetDepends *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  mapped_type_conflict *pmVar5;
  pointer ppcVar6;
  pointer ppcVar7;
  cmGeneratorTarget *ti;
  cmGeneratorTarget *local_38;
  
  ppcVar1 = (this->GlobalGenerator->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar6 = (this->GlobalGenerator->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppcVar6 != ppcVar1; ppcVar6 = ppcVar6 + 1) {
    ppcVar2 = ((*ppcVar6)->GeneratorTargets).
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar7 = ((*ppcVar6)->GeneratorTargets).
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar2;
        ppcVar7 = ppcVar7 + 1) {
      local_38 = *ppcVar7;
      ppcVar3 = (this->Targets).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppcVar4 = (this->Targets).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pmVar5 = std::
               map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
               ::operator[](&this->TargetIndex,&local_38);
      *pmVar5 = (mapped_type_conflict)((ulong)((long)ppcVar3 - (long)ppcVar4) >> 3);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (&this->Targets,&local_38);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargets()
{
  // Collect all targets from all generators.
  std::vector<cmLocalGenerator*> const& lgens =
    this->GlobalGenerator->GetLocalGenerators();
  for (cmLocalGenerator* lgen : lgens) {
    const std::vector<cmGeneratorTarget*>& targets =
      lgen->GetGeneratorTargets();
    for (cmGeneratorTarget const* ti : targets) {
      int index = static_cast<int>(this->Targets.size());
      this->TargetIndex[ti] = index;
      this->Targets.push_back(ti);
    }
  }
}